

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  pointer ppcVar2;
  bool bVar3;
  char *pcVar4;
  pointer *__ptr;
  int i;
  int index;
  uint index_00;
  char *in_R9;
  AssertionResult gtest_ar__5;
  hasher hasher;
  AssertionResult gtest_ar_;
  TypeParam ht3;
  TypeParam ht1;
  TypeParam ht2;
  undefined1 local_238 [8];
  undefined8 local_230;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_228;
  AssertHelper local_220;
  hasher local_218;
  pair<google::BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_208;
  undefined1 local_1e0 [8];
  int *local_1d8;
  char local_1d0 [112];
  pointer local_160;
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  local_150;
  undefined1 local_c0 [8];
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  local_b8;
  
  local_1e0 = (undefined1  [8])0x0;
  local_1d8 = (int *)((ulong)local_1d8 & 0xffffffff00000000);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_208.first.super_iterator.pos =
       (pointer)((ulong)local_208.first.super_iterator.pos & 0xffffffff00000000);
  local_c0 = (undefined1  [8])((ulong)local_c0 & 0xffffffff00000000);
  local_b8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_150,0,(hasher *)local_1e0,(key_equal *)&local_208,(allocator_type *)local_c0);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_208.first.super_iterator.pos =
       (pointer)((ulong)local_208.first.super_iterator.pos & 0xffffffff00000000);
  local_238 = (undefined1  [8])0x0;
  local_230 = (undefined8 *)((ulong)local_230._4_4_ << 0x20);
  local_1e0 = (undefined1  [8])((ulong)local_1e0 & 0xffffffff00000000);
  local_1d8 = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)local_c0,0,(hasher *)&local_208,(key_equal *)local_238,(allocator_type *)local_1e0);
  this_00 = &local_150.
             super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_208.first.super_iterator.ht._1_7_,bVar3);
  local_208.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e0,(internal *)&local_208,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  ppcVar2 = local_208.first.super_iterator.pos;
  if (local_208.first.super_iterator.pos != (pointer)0x0) {
    if ((pointer)*local_208.first.super_iterator.pos != local_208.first.super_iterator.pos + 2) {
      operator_delete(*local_208.first.super_iterator.pos);
    }
    operator_delete(ppcVar2);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_208.first.super_iterator.ht._1_7_,bVar3);
  local_208.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e0,(internal *)&local_208,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  ppcVar2 = local_208.first.super_iterator.pos;
  if (local_208.first.super_iterator.pos != (pointer)0x0) {
    if ((pointer)*local_208.first.super_iterator.pos != local_208.first.super_iterator.pos + 2) {
      operator_delete(*local_208.first.super_iterator.pos);
    }
    operator_delete(ppcVar2);
  }
  pcVar4 = UniqueObjectHelper<char_const*>(1);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  local_150.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_ =
       true;
  local_150.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = pcVar4;
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_208.first.super_iterator.ht._1_7_,bVar3);
  local_208.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e0,(internal *)&local_208,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  ppcVar2 = local_208.first.super_iterator.pos;
  if (local_208.first.super_iterator.pos != (pointer)0x0) {
    if ((pointer)*local_208.first.super_iterator.pos != local_208.first.super_iterator.pos + 2) {
      operator_delete(*local_208.first.super_iterator.pos);
    }
    operator_delete(ppcVar2);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_208.first.super_iterator.ht._1_7_,bVar3);
  local_208.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e0,(internal *)&local_208,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  ppcVar2 = local_208.first.super_iterator.pos;
  if (local_208.first.super_iterator.pos != (pointer)0x0) {
    if ((pointer)*local_208.first.super_iterator.pos != local_208.first.super_iterator.pos + 2) {
      operator_delete(*local_208.first.super_iterator.pos);
    }
    operator_delete(ppcVar2);
  }
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::resize(this_00,2000);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_208.first.super_iterator.ht._1_7_,bVar3);
  local_208.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1e0,(internal *)&local_208,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_238 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  ppcVar2 = local_208.first.super_iterator.pos;
  if (local_208.first.super_iterator.pos != (pointer)0x0) {
    if ((pointer)*local_208.first.super_iterator.pos != local_208.first.super_iterator.pos + 2) {
      operator_delete(*local_208.first.super_iterator.pos);
    }
    operator_delete(ppcVar2);
  }
  local_218.id_ = 1;
  local_218.num_hashes_ = 0;
  local_218.num_compares_ = 0;
  local_208.first.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_208.first.super_iterator.ht._4_4_,2);
  local_208.first.super_iterator.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)local_1e0,5,&local_218,&local_218,(allocator_type *)&local_208);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d8);
  local_238[0] = bVar3;
  local_230 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_208,(internal *)local_238,(AssertionResult *)"ht1 == ht3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,(char *)local_208.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_208.first.super_iterator.ht !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_208.first.super_iterator + 0x10U)) {
      operator_delete(local_208.first.super_iterator.ht);
    }
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  puVar1 = local_230;
  if (local_230 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_230 != local_230 + 2) {
      operator_delete((undefined8 *)*local_230);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d8);
  local_238[0] = bVar3;
  local_230 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_208,(internal *)local_238,(AssertionResult *)"ht1 != ht3","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,(char *)local_208.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_208.first.super_iterator.ht !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_208.first.super_iterator + 0x10U)) {
      operator_delete(local_208.first.super_iterator.ht);
    }
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  puVar1 = local_230;
  if (local_230 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_230 != local_230 + 2) {
      operator_delete((undefined8 *)*local_230);
    }
    operator_delete(puVar1);
  }
  local_238 = (undefined1  [8])UniqueObjectHelper<char_const*>(2);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_208,
           &local_150.
            super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_238);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_238[0] = !bVar3;
  local_230 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_208,(internal *)local_238,(AssertionResult *)"ht1 != ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,(char *)local_208.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_208.first.super_iterator.ht !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_208.first.super_iterator + 0x10U)) {
      operator_delete(local_208.first.super_iterator.ht);
    }
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  puVar1 = local_230;
  if (local_230 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_230 != local_230 + 2) {
      operator_delete((undefined8 *)*local_230);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_238[0] = !bVar3;
  local_230 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_208,(internal *)local_238,(AssertionResult *)"ht1 == ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,(char *)local_208.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_208.first.super_iterator.ht !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_208.first.super_iterator + 0x10U)) {
      operator_delete(local_208.first.super_iterator.ht);
    }
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  puVar1 = local_230;
  if (local_230 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_230 != local_230 + 2) {
      operator_delete((undefined8 *)*local_230);
    }
    operator_delete(puVar1);
  }
  local_238 = (undefined1  [8])UniqueObjectHelper<char_const*>(2);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_208,
           (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_c0,(value_type *)local_238);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_238[0] = bVar3;
  local_230 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_208,(internal *)local_238,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,(char *)local_208.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_208.first.super_iterator.ht !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_208.first.super_iterator + 0x10U)) {
      operator_delete(local_208.first.super_iterator.ht);
    }
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  puVar1 = local_230;
  if (local_230 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_230 != local_230 + 2) {
      operator_delete((undefined8 *)*local_230);
    }
    operator_delete(puVar1);
  }
  index = 3;
  do {
    local_238 = (undefined1  [8])UniqueObjectHelper<char_const*>(index);
    google::
    BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_208,
             &local_150.
              super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)local_238);
    index = index + 1;
  } while (index != 0x7d1);
  index_00 = 0x7d1;
  do {
    index_00 = index_00 - 1;
    local_238 = (undefined1  [8])UniqueObjectHelper<char_const*>(index_00);
    google::
    BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_208,
             (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_c0,(value_type *)local_238);
  } while (3 < index_00);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b8);
  local_238[0] = bVar3;
  local_230 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_208,(internal *)local_238,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,(char *)local_208.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_208.first.super_iterator.ht !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_208.first.super_iterator + 0x10U)) {
      operator_delete(local_208.first.super_iterator.ht);
    }
    if (local_228._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
  }
  puVar1 = local_230;
  if (local_230 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_230 != local_230 + 2) {
      operator_delete((undefined8 *)*local_230);
    }
    operator_delete(puVar1);
  }
  local_1e0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c267e8;
  if (local_160 != (pointer)0x0) {
    free(local_160);
  }
  local_c0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c267e8;
  if (local_b8.table != (pointer)0x0) {
    free(local_b8.table);
  }
  local_150.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c267e8;
  if (local_150.
      super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_150.
         super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}